

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockContextBuildNodesFromSettings
               (ImGuiContext *ctx,ImGuiDockNodeSettings *node_settings_array,int node_settings_count
               )

{
  short sVar1;
  uint uVar2;
  ImGuiID key;
  ImGuiDockNode *pIVar3;
  ImGuiDockNode *pIVar4;
  ImGuiDockNode **ppIVar5;
  ImGuiWindow *pIVar6;
  ImGuiDockNode *pIVar7;
  ulong uVar8;
  char host_window_title [20];
  char local_48 [24];
  
  if (0 < node_settings_count) {
    uVar8 = 0;
    do {
      if (node_settings_array[uVar8].ID != 0) {
        pIVar3 = DockContextAddNode(ctx,node_settings_array[uVar8].ID);
        if (node_settings_array[uVar8].ParentNodeId == 0) {
          pIVar4 = (ImGuiDockNode *)0x0;
        }
        else {
          pIVar4 = (ImGuiDockNode *)
                   ImGuiStorage::GetVoidPtr
                             (&(ctx->DockContext).Nodes,node_settings_array[uVar8].ParentNodeId);
        }
        pIVar3->ParentNode = pIVar4;
        sVar1 = node_settings_array[uVar8].Pos.y;
        (pIVar3->Pos).x = (float)(int)node_settings_array[uVar8].Pos.x;
        (pIVar3->Pos).y = (float)(int)sVar1;
        sVar1 = node_settings_array[uVar8].Size.y;
        (pIVar3->Size).x = (float)(int)node_settings_array[uVar8].Size.x;
        (pIVar3->Size).y = (float)(int)sVar1;
        sVar1 = node_settings_array[uVar8].SizeRef.y;
        (pIVar3->SizeRef).x = (float)(int)node_settings_array[uVar8].SizeRef.x;
        (pIVar3->SizeRef).y = (float)(int)sVar1;
        *(ushort *)&pIVar3->field_0xbc = (ushort)*(undefined4 *)&pIVar3->field_0xbc & 0xfe00 | 0x49;
        if (pIVar4 != (ImGuiDockNode *)0x0) {
          if (pIVar4->ChildNodes[0] == (ImGuiDockNode *)0x0) {
            ppIVar5 = pIVar4->ChildNodes;
          }
          else {
            if ((pIVar4 == (ImGuiDockNode *)0x0) || (pIVar4->ChildNodes[1] != (ImGuiDockNode *)0x0))
            goto LAB_00140ec3;
            ppIVar5 = pIVar4->ChildNodes + 1;
          }
          *ppIVar5 = pIVar3;
        }
LAB_00140ec3:
        pIVar3->SelectedTabId = node_settings_array[uVar8].SelectedTabId;
        pIVar3->SplitAxis = (int)node_settings_array[uVar8].SplitAxis;
        uVar2 = node_settings_array[uVar8].Flags & 0xc1fc20;
        pIVar3->LocalFlags = uVar2;
        pIVar3->MergedFlags = pIVar3->SharedFlags | pIVar3->LocalFlagsInWindows | uVar2;
        pIVar4 = pIVar3;
        do {
          pIVar7 = pIVar4;
          pIVar4 = pIVar7->ParentNode;
        } while (pIVar4 != (ImGuiDockNode *)0x0);
        ImFormatString(local_48,0x14,"##DockNode_%02X",(ulong)pIVar7->ID);
        key = ImHashStr(local_48,0,0);
        pIVar6 = (ImGuiWindow *)ImGuiStorage::GetVoidPtr(&GImGui->WindowsById,key);
        pIVar3->HostWindow = pIVar6;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uint)node_settings_count);
  }
  return;
}

Assistant:

static void ImGui::DockContextBuildNodesFromSettings(ImGuiContext* ctx, ImGuiDockNodeSettings* node_settings_array, int node_settings_count)
{
    // Build nodes
    for (int node_n = 0; node_n < node_settings_count; node_n++)
    {
        ImGuiDockNodeSettings* settings = &node_settings_array[node_n];
        if (settings->ID == 0)
            continue;
        ImGuiDockNode* node = DockContextAddNode(ctx, settings->ID);
        node->ParentNode = settings->ParentNodeId ? DockContextFindNodeByID(ctx, settings->ParentNodeId) : NULL;
        node->Pos = ImVec2(settings->Pos.x, settings->Pos.y);
        node->Size = ImVec2(settings->Size.x, settings->Size.y);
        node->SizeRef = ImVec2(settings->SizeRef.x, settings->SizeRef.y);
        node->AuthorityForPos = node->AuthorityForSize = node->AuthorityForViewport = ImGuiDataAuthority_DockNode;
        if (node->ParentNode && node->ParentNode->ChildNodes[0] == NULL)
            node->ParentNode->ChildNodes[0] = node;
        else if (node->ParentNode && node->ParentNode->ChildNodes[1] == NULL)
            node->ParentNode->ChildNodes[1] = node;
        node->SelectedTabId = settings->SelectedTabId;
        node->SplitAxis = (ImGuiAxis)settings->SplitAxis;
        node->SetLocalFlags(settings->Flags & ImGuiDockNodeFlags_SavedFlagsMask_);

        // Bind host window immediately if it already exist (in case of a rebuild)
        // This is useful as the RootWindowForTitleBarHighlight links necessary to highlight the currently focused node requires node->HostWindow to be set.
        char host_window_title[20];
        ImGuiDockNode* root_node = DockNodeGetRootNode(node);
        node->HostWindow = FindWindowByName(DockNodeGetHostWindowTitle(root_node, host_window_title, IM_ARRAYSIZE(host_window_title)));
    }
}